

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::bt_peer_connection::write_share_mode(bt_peer_connection *this)

{
  uchar val;
  span<const_char> buf;
  shared_ptr<libtorrent::torrent> t;
  __weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_20,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_20._M_refcount);
  if (this->m_share_mode_id != '\0') {
    local_20._M_ptr._4_1_ = 0x14;
    local_20._M_ptr._0_4_ = 0x3000000;
    local_20._M_ptr._6_1_ =
         (byte)((uint)*(undefined4 *)
                       &((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_torrent_hot_members).field_0x38 >> 0x1d) & 1;
    buf.m_len = 7;
    buf.m_ptr = (char *)&local_20;
    local_20._M_ptr._5_1_ = this->m_share_mode_id;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
    counters::inc_stats_counter((this->super_peer_connection).m_counters,0x68,1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void bt_peer_connection::write_share_mode()
	{
		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = associated_torrent().lock();
		if (m_share_mode_id == 0) return;

		char msg[7] = {0, 0, 0, 3, msg_extended};
		char* ptr = msg + 5;
		detail::write_uint8(m_share_mode_id, ptr);
		detail::write_uint8(t->share_mode(), ptr);
		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_extended);
	}